

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void grounding_end(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  const_reference pvVar2;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  char *unaff_retaddr;
  
  pvVar2 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                     (&race_table,(long)in_RDI->race);
  bVar1 = str_cmp(pvVar2->name,"imp");
  if (bVar1) {
    pvVar2 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                       (&race_table,(long)in_RDI->race);
    bVar1 = str_cmp(pvVar2->name,"sidhe");
    if (bVar1) goto LAB_006e1f90;
  }
  _Var3 = std::pow<int,int>(0,0x6e1f67);
  in_RDI->affected_by[0] = (long)_Var3 | in_RDI->affected_by[0];
  send_to_char(unaff_retaddr,in_RDI);
LAB_006e1f90:
  bVar1 = is_affected(in_RDI,(int)gsn_fly);
  if (bVar1) {
    _Var3 = std::pow<int,int>(0,0x6e1fb9);
    in_RDI->affected_by[0] = (long)_Var3 | in_RDI->affected_by[0];
    send_to_char(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void grounding_end(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if (!str_cmp(race_table[ch->race].name, "imp") || !str_cmp(race_table[ch->race].name, "sidhe"))
	{
		SET_BIT(ch->affected_by, AFF_FLYING);
		send_to_char("As the magical grounding expires, you rise once more on your natural wings.\n\r", ch);
	}

	if (is_affected(ch, gsn_fly))
	{
		SET_BIT(ch->affected_by, AFF_FLYING);
		send_to_char("As the grounding expires, your fly spell regains its effectiveness.\n\r", ch);
	}
}